

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

QFlags<Qt::GestureFlag> __thiscall
QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::value
          (QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *this,GestureType *key,
          QFlags<Qt::GestureFlag> *defaultValue)

{
  _Rb_tree_color _Var1;
  QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
  *pQVar2;
  _Rb_tree_header *p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  
  pQVar2 = (this->d).d.ptr;
  if ((pQVar2 != (QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
                  *)0x0) &&
     (p_Var4 = *(_Base_ptr *)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8),
     p_Var4 != (_Base_ptr)0x0)) {
    p_Var3 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header;
    _Var1 = *key;
    p_Var5 = &p_Var3->_M_header;
    do {
      bVar6 = p_Var4[1]._M_color < _Var1;
      if (!bVar6) {
        p_Var5 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[bVar6];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var3) && (p_Var5[1]._M_color <= _Var1)) {
      defaultValue = (QFlags<Qt::GestureFlag> *)&p_Var5[1].field_0x4;
    }
  }
  return (QFlagsStorageHelper<Qt::GestureFlag,_4>)
         (QFlagsStorageHelper<Qt::GestureFlag,_4>)
         (defaultValue->super_QFlagsStorageHelper<Qt::GestureFlag,_4>).
         super_QFlagsStorage<Qt::GestureFlag>.i;
}

Assistant:

constexpr P get() const noexcept { return ptr; }